

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlFreeParserCtxt(PyObject *self,PyObject *args)

{
  undefined8 *puVar1;
  long *plVar2;
  int iVar3;
  undefined *in_RAX;
  long lVar4;
  PyObject *pPVar5;
  PyObject *pyobj_ctxt;
  undefined *local_18;
  
  pPVar5 = (PyObject *)0x0;
  local_18 = in_RAX;
  iVar3 = _PyArg_ParseTuple_SizeT(args,"O:xmlFreeParserCtxt",&local_18);
  if (iVar3 != 0) {
    if (local_18 == &_Py_NoneStruct) {
      lVar4 = 0;
    }
    else {
      lVar4 = *(long *)(local_18 + 0x10);
    }
    if (lVar4 != 0) {
      puVar1 = *(undefined8 **)(lVar4 + 0x1a8);
      if (puVar1 != (undefined8 *)0x0) {
        plVar2 = (long *)*puVar1;
        if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
          _Py_Dealloc();
        }
        plVar2 = (long *)puVar1[1];
        if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
          _Py_Dealloc();
        }
        (*_xmlFree)(puVar1);
      }
      xmlFreeParserCtxt(lVar4);
    }
    pPVar5 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  return pPVar5;
}

Assistant:

static PyObject *
libxml_xmlFreeParserCtxt(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlFreeParserCtxt", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    if (ctxt != NULL) {
	pyCtxt = (xmlParserCtxtPyCtxtPtr)((xmlParserCtxtPtr)ctxt)->_private;
	if (pyCtxt) {
	    Py_XDECREF(pyCtxt->f);
	    Py_XDECREF(pyCtxt->arg);
	    xmlFree(pyCtxt);
	}
	xmlFreeParserCtxt(ctxt);
    }

    Py_INCREF(Py_None);
    return(Py_None);
}